

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapl-configure.c
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  raplcap_limit *limit_long;
  bool bVar4;
  bool bVar5;
  uint32_t pkg;
  uint32_t die;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  char *pcVar15;
  char *pcVar16;
  raplcap_limit *limit_short;
  undefined4 uVar17;
  undefined4 uVar18;
  size_t sStack_140;
  double local_130;
  double local_128;
  double local_120;
  raplcap_zone local_114;
  raplcap_zone rStack_100;
  raplcap_constraint rStack_fc;
  uint32_t local_f8;
  uint32_t uStack_f4;
  int iStack_f0;
  raplcap_limit rStack_e0;
  undefined8 uStack_d0;
  raplcap_limit local_c8;
  undefined8 local_b8;
  raplcap_limit rStack_b0;
  undefined8 local_a0;
  double local_98;
  double local_90;
  int local_84;
  uint32_t local_80;
  int local_7c;
  double local_78;
  double local_70;
  raplcap_limit ls;
  raplcap_limit ll;
  raplcap_limit local_48;
  
  local_b8 = 0;
  rStack_b0.seconds = 0.0;
  local_c8.seconds = 0.0;
  local_c8.watts = 0.0;
  rStack_e0.watts = 0.0;
  uStack_d0 = 0;
  rStack_e0.seconds = 0.0;
  local_f8 = 0;
  uStack_f4 = 0;
  iStack_f0 = 0;
  bVar5 = false;
  rStack_100 = RAPLCAP_ZONE_PACKAGE;
  rStack_fc = RAPLCAP_CONSTRAINT_LONG_TERM;
  rStack_b0.watts = 0.0;
  prog = *argv;
  local_128 = 0.0;
  local_130 = 0.0;
  uStack_d0._0_4_ = 0;
  local_a0 = 0;
  local_120 = 0.0;
  local_70 = 0.0;
  local_114 = RAPLCAP_ZONE_PACKAGE;
  local_80 = 0;
  iVar14 = 0;
  bVar4 = false;
  local_90 = (double)((ulong)local_90 & 0xffffffff00000000);
  local_84 = 0;
  local_98 = (double)((ulong)local_98 & 0xffffffff00000000);
  local_7c = 0;
  local_78 = (double)((ulong)local_78 & 0xffffffff00000000);
  uVar9 = (undefined4)uStack_d0;
  do {
    uVar10 = uVar9;
    iVar11 = getopt_long(argc,argv,"nNc:d:z:l:t:p:e:s:w:S:W:C:Lh",long_options,0);
    pcVar16 = _optarg;
    uVar9 = uVar10;
    switch(iVar11) {
    case 99:
      local_f8 = atoi(_optarg);
      local_98 = (double)CONCAT44(local_98._4_4_,local_f8);
      break;
    case 100:
      local_80 = atoi(_optarg);
      uStack_f4 = local_80;
      break;
    case 0x65:
      iStack_f0 = atoi(_optarg);
      bVar5 = true;
      local_84 = 1;
      break;
    case 0x68:
      local_c8.watts = local_130;
      uStack_d0 = CONCAT44(uStack_d0._4_4_,uVar10);
      local_c8.seconds = local_128;
      rStack_e0.watts = local_120;
      print_usage(0);
    case 0x6c:
      iVar11 = strcmp(_optarg,"LONG");
      if (iVar11 == 0) {
        rStack_fc = RAPLCAP_CONSTRAINT_LONG_TERM;
        local_a0 = 0;
      }
      else {
        iVar11 = strcmp(pcVar16,"SHORT");
        if (iVar11 == 0) {
          rStack_fc = RAPLCAP_CONSTRAINT_SHORT_TERM;
          sStack_140 = 1;
        }
        else {
          iVar11 = strcmp(pcVar16,"PEAK");
          if (iVar11 != 0) goto switchD_00102414_caseD_66;
          rStack_fc = RAPLCAP_CONSTRAINT_PEAK_POWER;
          sStack_140 = 2;
        }
        local_a0 = sStack_140;
      }
      break;
    case 0x6e:
      local_78 = (double)CONCAT44(local_78._4_4_,1);
      break;
    case 0x70:
      rStack_b0.watts = atof(_optarg);
      uVar17 = SUB84(rStack_b0.watts,0);
      uVar18 = (undefined4)((ulong)rStack_b0.watts >> 0x20);
      goto LAB_001024bf;
    case 0x73:
      rStack_e0.seconds = atof(_optarg);
      uVar17 = SUB84(rStack_e0.seconds,0);
      uVar18 = (undefined4)((ulong)rStack_e0.seconds >> 0x20);
      goto LAB_001025ac;
    case 0x74:
      rStack_b0.seconds = atof(_optarg);
      uVar17 = SUB84(rStack_b0.seconds,0);
      uVar18 = (undefined4)((ulong)rStack_b0.seconds >> 0x20);
      local_70 = rStack_b0.seconds;
LAB_001024bf:
      if ((double)CONCAT44(uVar18,uVar17) <= 0.0) goto LAB_00102d02;
      local_b8 = CONCAT44(local_b8._4_4_,1);
      iVar14 = 1;
      break;
    case 0x77:
      local_120 = atof(_optarg);
      uVar17 = SUB84(local_120,0);
      uVar18 = (undefined4)((ulong)local_120 >> 0x20);
LAB_001025ac:
      if ((double)CONCAT44(uVar18,uVar17) <= 0.0) goto LAB_00102d02;
      local_90 = (double)CONCAT44(local_90._4_4_,1);
      break;
    case 0x7a:
      iVar11 = strcmp(_optarg,"PACKAGE");
      if (iVar11 == 0) {
        rStack_100 = RAPLCAP_ZONE_PACKAGE;
        local_114 = RAPLCAP_ZONE_PACKAGE;
        break;
      }
      iVar11 = strcmp(pcVar16,"CORE");
      if (iVar11 == 0) {
        rStack_100 = RAPLCAP_ZONE_CORE;
        local_114 = RAPLCAP_ZONE_CORE;
        break;
      }
      iVar11 = strcmp(pcVar16,"UNCORE");
      if (iVar11 == 0) {
        rStack_100 = RAPLCAP_ZONE_UNCORE;
        local_114 = RAPLCAP_ZONE_UNCORE;
        break;
      }
      iVar11 = strcmp(pcVar16,"DRAM");
      if (iVar11 == 0) {
        rStack_100 = RAPLCAP_ZONE_DRAM;
        local_114 = RAPLCAP_ZONE_DRAM;
        break;
      }
      iVar11 = strcmp(pcVar16,"PSYS");
      if (iVar11 == 0) {
        rStack_100 = RAPLCAP_ZONE_PSYS;
        local_114 = RAPLCAP_ZONE_PSYS;
        break;
      }
    case 0x66:
    case 0x67:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6d:
    case 0x6f:
    case 0x71:
    case 0x72:
    case 0x75:
    case 0x76:
    case 0x78:
    case 0x79:
switchD_00102414_caseD_66:
      local_c8.watts = local_130;
      uStack_d0 = CONCAT44(uStack_d0._4_4_,uVar10);
      local_c8.seconds = local_128;
      rStack_e0.watts = local_120;
      goto LAB_00102d72;
    default:
      if (iVar11 == 0x4e) {
        local_7c = 1;
      }
      else {
        if (iVar11 == 0x53) {
          local_128 = atof(_optarg);
          uVar17 = SUB84(local_128,0);
          uVar18 = (undefined4)((ulong)local_128 >> 0x20);
        }
        else {
          if (iVar11 != 0x57) {
            if (iVar11 != -1) goto switchD_00102414_caseD_66;
            local_c8.watts = local_130;
            uStack_d0 = CONCAT44(uStack_d0._4_4_,uVar10);
            local_c8.seconds = local_128;
            rStack_e0.watts = local_120;
            if (local_78._0_4_ != 0) {
              uVar12 = raplcap_get_num_packages((raplcap *)0x0);
              if (uVar12 != 0) {
LAB_001027d9:
                printf("%u\n",(ulong)uVar12);
                return 0;
              }
              pcVar16 = "Failed to get number of packages";
LAB_00102c8b:
              perror(pcVar16);
              return 1;
            }
            pkg = local_98._0_4_;
            if (local_7c != 0) {
              uVar12 = raplcap_get_num_die((raplcap *)0x0,local_98._0_4_);
              if (uVar12 != 0) goto LAB_001027d9;
              pcVar16 = "Failed to get number of die";
              goto LAB_00102c8b;
            }
            iVar11 = local_90._0_4_;
            bVar2 = local_84 != 0;
            bVar3 = local_90._0_4_ != 0;
            if (((!bVar2 && !bVar3) && !bVar4) && iVar14 == 0) {
              setenv("RAPLCAP_READ_ONLY","1",0);
            }
            iVar13 = raplcap_init((raplcap *)0x0);
            die = local_80;
            if (iVar13 != 0) {
              pcVar16 = "Failed to initialize";
              goto LAB_00102c8b;
            }
            iVar13 = raplcap_pd_is_zone_supported((raplcap *)0x0,pkg,local_80,local_114);
            if (-1 < iVar13) {
              if (iVar13 != 0) goto LAB_00102890;
              pcVar16 = "Zone not supported\n";
              sStack_140 = 0x13;
LAB_00102cb8:
              fwrite(pcVar16,sStack_140,1,_stderr);
              iVar14 = -1;
              goto LAB_00102ce2;
            }
            print_error_continue("Failed to determine if zone is supported");
LAB_00102890:
            if (((bVar2 || bVar3) || bVar4) || iVar14 != 0) {
              iVar13 = raplcap_pd_is_constraint_supported
                                 ((raplcap *)0x0,pkg,die,local_114,(raplcap_constraint)local_a0);
              if (iVar13 < 0) {
                print_error_continue("Failed to determine if constraint is supported");
              }
              else if (iVar13 == 0) {
                pcVar16 = "Constraint not supported\n";
                sStack_140 = 0x19;
                goto LAB_00102cb8;
              }
              if (((int)local_a0 == 2) && (0.0 < local_70)) {
                pcVar16 = "Cannot set a time window for peak power\n";
                sStack_140 = 0x28;
                goto LAB_00102cb8;
              }
              if (bVar4) {
                iVar14 = raplcap_pd_is_constraint_supported
                                   ((raplcap *)0x0,pkg,die,local_114,RAPLCAP_CONSTRAINT_SHORT_TERM);
                if (iVar14 < 0) {
                  print_error_continue("Failed to determine if short term constraint is supported");
                }
                else if (iVar14 == 0) {
                  pcVar16 = "Short term constraint not supported\n";
                  sStack_140 = 0x24;
                  goto LAB_00102cb8;
                }
LAB_00102be3:
                limit_short = &local_c8;
                if (!bVar4) {
                  limit_short = (raplcap_limit *)0x0;
                }
                limit_long = &rStack_e0;
                if (iVar11 == 0) {
                  limit_short = &local_c8;
                  limit_long = (raplcap_limit *)0x0;
                }
                iVar14 = raplcap_pd_set_limits
                                   ((raplcap *)0x0,pkg,die,local_114,limit_long,limit_short);
                if (iVar14 != 0) {
                  pcVar16 = "Failed to set limits";
                  goto LAB_00102cdd;
                }
                iVar14 = (int)local_b8;
              }
              else if (iVar11 != 0) goto LAB_00102be3;
              if ((iVar14 == 0) ||
                 (iVar14 = raplcap_pd_set_limit
                                     ((raplcap *)0x0,local_f8,uStack_f4,rStack_100,rStack_fc,
                                      &rStack_b0), iVar14 == 0)) {
                if (!bVar5) {
                  iVar14 = 0;
                  goto LAB_00102ce2;
                }
                iVar14 = 0;
                iVar11 = raplcap_pd_set_zone_enabled
                                   ((raplcap *)0x0,local_f8,uStack_f4,rStack_100,iStack_f0);
                if (iVar11 == 0) goto LAB_00102ce2;
                pcVar16 = "Failed to enable/disable zone";
                iVar14 = iVar11;
              }
              else {
                pcVar16 = "Failed to set limit";
              }
            }
            else {
              ll.seconds = 0.0;
              ll.watts = 0.0;
              ls.seconds = 0.0;
              ls.watts = 0.0;
              local_48.seconds = 0.0;
              local_48.watts = 0.0;
              iVar11 = raplcap_pd_is_zone_enabled((raplcap *)0x0,pkg,die,local_114);
              if (iVar11 < 0) {
                print_error_continue("Failed to determine if zone is enabled");
              }
              iVar14 = raplcap_pd_get_limits((raplcap *)0x0,pkg,die,local_114,&ll,&ls);
              if (iVar14 == 0) {
                iVar14 = raplcap_pd_is_constraint_supported
                                   ((raplcap *)0x0,pkg,die,local_114,RAPLCAP_CONSTRAINT_PEAK_POWER);
                if (iVar14 < 0) {
                  print_error_continue("Failed to determine if peak power constraint is supported");
                }
                else if ((iVar14 != 0) &&
                        (iVar14 = raplcap_pd_get_limit
                                            ((raplcap *)0x0,pkg,die,local_114,
                                             RAPLCAP_CONSTRAINT_PEAK_POWER,&local_48), iVar14 != 0))
                {
                  pcVar16 = "Failed to get peak power limit";
                  goto LAB_00102cdd;
                }
                dVar1 = raplcap_pd_get_energy_counter((raplcap *)0x0,pkg,die,local_114);
                local_90 = raplcap_pd_get_energy_counter_max((raplcap *)0x0,pkg,die,local_114);
                dVar8 = local_48.watts;
                dVar7 = ll.seconds;
                dVar6 = ls.seconds;
                local_78 = ll.watts;
                local_98 = ls.watts;
                pcVar16 = "true";
                if (iVar11 == 0) {
                  pcVar16 = "false";
                }
                pcVar15 = "unknown";
                if (-1 < iVar11) {
                  pcVar15 = pcVar16;
                }
                printf("%13s: %s\n","enabled",pcVar15);
                printf("%13s: %.12f\n",SUB84(local_78,0),"watts_long");
                printf("%13s: %.12f\n",SUB84(dVar7,0),"seconds_long");
                if (0.0 < dVar6) {
                  printf("%13s: %.12f\n",SUB84(local_98,0),"watts_short");
                  printf("%13s: %.12f\n",SUB84(dVar6,0),"seconds_short");
                }
                if (0.0 < dVar8) {
                  printf("%13s: %.12f\n","watts_peak");
                }
                if (0.0 <= dVar1) {
                  printf("%13s: %.12f\n","joules");
                }
                iVar14 = 0;
                if (0.0 <= local_90) {
                  printf("%13s: %.12f\n","joules_max");
                }
                goto LAB_00102ce2;
              }
              pcVar16 = "Failed to get limits";
            }
LAB_00102cdd:
            perror(pcVar16);
LAB_00102ce2:
            iVar11 = raplcap_destroy((raplcap *)0x0);
            if (iVar11 == 0) {
              return iVar14;
            }
            perror("Failed to clean up");
            return iVar14;
          }
          local_130 = atof(_optarg);
          uVar17 = SUB84(local_130,0);
          uVar18 = (undefined4)((ulong)local_130 >> 0x20);
        }
        bVar4 = true;
        uVar9 = 1;
        if ((double)CONCAT44(uVar18,uVar17) <= 0.0) {
LAB_00102d02:
          local_c8.watts = local_130;
          uStack_d0 = CONCAT44(uStack_d0._4_4_,uVar10);
          local_c8.seconds = local_128;
          rStack_e0.watts = local_120;
          fwrite("Time window and power limit values must be > 0\n",0x2f,1,_stderr);
LAB_00102d72:
          print_usage(1);
        }
      }
    }
  } while( true );
}

Assistant:

int main(int argc, char** argv) {
  rapl_configure_ctx ctx = { 0 };
  int ret = 0;
  int c;
  uint32_t count;
  prog = argv[0];
  int is_read_only;

  // parse parameters
  while ((c = getopt_long(argc, argv, short_options, long_options, NULL)) != -1) {
    switch (c) {
      case 'h':
        print_usage(0);
        break;
      case 'c':
        ctx.pkg = (unsigned int) atoi(optarg);
        break;
      case 'd':
        ctx.die = (unsigned int) atoi(optarg);
        break;
      case 'n':
        ctx.get_packages = 1;
        break;
      case 'N':
        ctx.get_die = 1;
        break;
      case 'z':
        if (!strcmp(optarg, "PACKAGE")) {
          ctx.zone = RAPLCAP_ZONE_PACKAGE;
        } else if (!strcmp(optarg, "CORE")) {
          ctx.zone = RAPLCAP_ZONE_CORE;
        } else if (!strcmp(optarg, "UNCORE")) {
          ctx.zone = RAPLCAP_ZONE_UNCORE;
        } else if (!strcmp(optarg, "DRAM")) {
          ctx.zone = RAPLCAP_ZONE_DRAM;
        } else if (!strcmp(optarg, "PSYS")) {
          ctx.zone = RAPLCAP_ZONE_PSYS;
        } else {
          print_usage(1);
        }
        break;
      case 'l':
        if (!strcmp(optarg, "LONG")) {
          ctx.constraint = RAPLCAP_CONSTRAINT_LONG_TERM;
        } else if (!strcmp(optarg, "SHORT")) {
          ctx.constraint = RAPLCAP_CONSTRAINT_SHORT_TERM;
        } else if (!strcmp(optarg, "PEAK")) {
          ctx.constraint = RAPLCAP_CONSTRAINT_PEAK_POWER;
        } else {
          print_usage(1);
        }
        break;
      case 't':
        SET_VAL(optarg, ctx.limit_constraint.seconds, ctx.set_constraint);
        break;
      case 'p':
        SET_VAL(optarg, ctx.limit_constraint.watts, ctx.set_constraint);
        break;
      case 'e':
        ctx.enabled = atoi(optarg);
        ctx.set_enabled = 1;
        break;
      case 's':
        SET_VAL(optarg, ctx.limit_long.seconds, ctx.set_long);
        break;
      case 'w':
        SET_VAL(optarg, ctx.limit_long.watts, ctx.set_long);
        break;
      case 'S':
        SET_VAL(optarg, ctx.limit_short.seconds, ctx.set_short);
        break;
      case 'W':
        SET_VAL(optarg, ctx.limit_short.watts, ctx.set_short);
        break;
#ifdef RAPLCAP_msr
      case 'C':
        ctx.clamped = atoi(optarg);
        ctx.set_clamped = 1;
        break;
      case 'L':
        ctx.set_locked = 1;
        break;
#endif // RAPLCAP_msr
      case '?':
      default:
        print_usage(1);
        break;
    }
  }

  // just print the number of packages or die and exit
  // these are often unprivileged operations since we don't need to initialize a raplcap instance
  if (ctx.get_packages) {
    count = raplcap_get_num_packages(NULL);
    if (count == 0) {
      perror("Failed to get number of packages");
      return 1;
    }
    printf("%"PRIu32"\n", count);
    return 0;
  }
  if (ctx.get_die) {
    count = raplcap_get_num_die(NULL, ctx.pkg);
    if (count == 0) {
      perror("Failed to get number of die");
      return 1;
    }
    printf("%"PRIu32"\n", count);
    return 0;
  }

  // initialize
  is_read_only = !ctx.set_enabled && !ctx.set_long && !ctx.set_short && !ctx.set_constraint;
#ifdef RAPLCAP_msr
  is_read_only &= !ctx.set_clamped && !ctx.set_locked;
#endif // RAPLCAP_msr
#ifndef _WIN32
  if (is_read_only) {
    // request read-only access (not supported by all implementations, therefore not guaranteed)
    setenv(ENV_RAPLCAP_READ_ONLY, "1", 0);
  }
#endif
  if (raplcap_init(NULL)) {
    perror("Failed to initialize");
    return 1;
  }

  if (!(ret = check_zone_supported(&ctx))) {
    // perform requested action
    if (is_read_only) {
      // TODO: Should we limit output by constraint, too?
      ret = get_limits(ctx.pkg, ctx.die, ctx.zone);
    } else if (!(ret = check_constraint_supported(&ctx))) {
      ret = configure_limits(&ctx);
    }
  }

  // cleanup
  if (raplcap_destroy(NULL)) {
    perror("Failed to clean up");
  }

  return ret;
}